

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int outputDpcmToFile(string *in_file_path,uchar *dpcm,int dpcmFrames,int dpcm_initial_volume)

{
  ostream *poVar1;
  bool bVar2;
  string outfname;
  ofstream ofs;
  byte abStack_1f8 [480];
  
  outfname._M_dataplus._M_p = (pointer)&outfname.field_2;
  outfname._M_string_length = 0;
  outfname.field_2._M_local_buf[0] = '\0';
  getFileNameDeletingExt(in_file_path,&outfname);
  std::__cxx11::string::append((char *)&outfname);
  std::__cxx11::to_string((string *)&ofs,dpcm_initial_volume);
  std::__cxx11::string::append((string *)&outfname);
  std::__cxx11::string::~string((string *)&ofs);
  std::__cxx11::string::append((char *)&outfname);
  poVar1 = std::operator<<((ostream *)&std::cout,"output dmc file: ");
  poVar1 = std::operator<<(poVar1,(string *)&outfname);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::ofstream(&ofs,(string *)&outfname,_S_trunc|_S_out|_S_bin);
  bVar2 = (abStack_1f8[*(long *)(_ofs + -0x18)] & 1) != 0;
  if (bVar2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"can not open file: ");
    poVar1 = std::operator<<(poVar1,(string *)&outfname);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    std::ostream::write((char *)&ofs,(long)dpcm);
  }
  std::ofstream::~ofstream(&ofs);
  std::__cxx11::string::~string((string *)&outfname);
  return (uint)bVar2;
}

Assistant:

int outputDpcmToFile(const std::string &in_file_path, const unsigned char *dpcm, int dpcmFrames, int dpcm_initial_volume)
{
	std::string outfname;
	getFileNameDeletingExt(in_file_path, outfname);
	outfname += "_i";
	outfname += std::to_string(dpcm_initial_volume);
	outfname += ".dmc";
	std::cout << "output dmc file: " << outfname << std::endl;
	
	std::ofstream ofs(outfname, std::ios::out|std::ios::binary|std::ios::trunc);
	if (!ofs.bad()) {
		ofs.write((char*)dpcm, dpcmFrames/8);
	}
	else {
		std::cout << "can not open file: " << outfname << std::endl;
		return 1;
	}
	return 0;
}